

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_builder.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::MessageBuilderGenerator::GenerateBuilderFieldParsingCase
          (MessageBuilderGenerator *this,Printer *printer,FieldDescriptor *field)

{
  ImmutableFieldGenerator *pIVar1;
  AlphaNum *a;
  string_view text;
  string_view text_00;
  string tagString;
  AlphaNum local_58;
  
  absl::lts_20240722::AlphaNum::AlphaNum
            (&local_58,
             *(int *)(field + 4) << 3 |
             *(uint *)((long)&protobuf::internal::WireFormatLite::kWireTypeForFieldType +
                      (ulong)(byte)field[2] * 4));
  absl::lts_20240722::StrCat_abi_cxx11_(&tagString,(lts_20240722 *)&local_58,a);
  text._M_str = "case $tag$: {\n";
  text._M_len = 0xe;
  io::Printer::Print<char[4],std::__cxx11::string>(printer,text,(char (*) [4])0x37eab5,&tagString);
  *(long *)(printer + 0x68) = *(long *)(printer + 0x68) + *(long *)(printer + 0x58);
  pIVar1 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                     (&this->field_generators_,field);
  (*(pIVar1->super_FieldGenerator)._vptr_FieldGenerator[0xf])(pIVar1,printer);
  google::protobuf::io::Printer::Outdent();
  text_00._M_str = "  break;\n} // case $tag$\n";
  text_00._M_len = 0x19;
  io::Printer::Print<char[4],std::__cxx11::string>
            (printer,text_00,(char (*) [4])0x37eab5,&tagString);
  std::__cxx11::string::~string((string *)&tagString);
  return;
}

Assistant:

void MessageBuilderGenerator::GenerateBuilderFieldParsingCase(
    io::Printer* printer, const FieldDescriptor* field) {
  uint32_t tag = WireFormatLite::MakeTag(
      field->number(), WireFormat::WireTypeForFieldType(field->type()));
  std::string tagString = absl::StrCat(static_cast<int32_t>(tag));
  printer->Print("case $tag$: {\n", "tag", tagString);
  printer->Indent();

  field_generators_.get(field).GenerateBuilderParsingCode(printer);

  printer->Outdent();
  printer->Print(
      "  break;\n"
      "} // case $tag$\n",
      "tag", tagString);
}